

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O2

void __thiscall HashUtil_Sha512ByteScript_Test::TestBody(HashUtil_Sha512ByteScript_Test *this)

{
  char *message;
  AssertHelper local_90;
  string local_88;
  AssertionResult gtest_ar;
  ByteData byte_data;
  Script target;
  
  std::__cxx11::string::string
            ((string *)&local_88,
             "21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac"
             ,(allocator *)&byte_data);
  cfd::core::Script::Script(&target,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  cfd::core::HashUtil::Sha512(&byte_data,&target);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_88,&byte_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"byte_data.GetHex().c_str()",
             "\"7ad6132c2611fd0496ad42c758edc1bc2a23c3a4c463e139e144e25c35a53765c4c4c99d68d821a1bdd71b10e88afebdba72bfa0ae3877f628f1e2eab5320229\""
             ,local_88._M_dataplus._M_p,
             "7ad6132c2611fd0496ad42c758edc1bc2a23c3a4c463e139e144e25c35a53765c4c4c99d68d821a1bdd71b10e88afebdba72bfa0ae3877f628f1e2eab5320229"
            );
  std::__cxx11::string::~string((string *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x150,message);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data);
  cfd::core::Script::~Script(&target);
  return;
}

Assistant:

TEST(HashUtil, Sha512ByteScript) {
  Script target(
      "21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac");
  ByteData byte_data = HashUtil::Sha512(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "7ad6132c2611fd0496ad42c758edc1bc2a23c3a4c463e139e144e25c35a53765c4c4c99d68d821a1bdd71b10e88afebdba72bfa0ae3877f628f1e2eab5320229");
}